

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtest.c
# Opt level: O2

int cmp_msg(long *msg,long *msg2,int n,int i)

{
  long *plVar1;
  long *plVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  uVar4 = 0;
  if (0 < n) {
    uVar4 = (ulong)(uint)n;
  }
  do {
    if (uVar4 == uVar3) {
      return 1;
    }
    plVar1 = msg + uVar3;
    plVar2 = msg2 + uVar3;
    uVar3 = uVar3 + 1;
  } while (*plVar1 == *plVar2);
  printf("Received message %d doesn\'t match sent message\n",(ulong)(uint)i);
  printf("in: ");
  print_msg(msg,n);
  putchar(10);
  printf("out:");
  print_msg(msg2,n);
  putchar(10);
  return 0;
}

Assistant:

int cmp_msg(long msg[], long msg2[], int n, int i)
{
    int j;
    for (j = 0; j < n; j++) {
        if (msg[j] != msg2[j]) {
            printf("Received message %d doesn't match sent message\n", i);
            printf("in: "); print_msg(msg, n); printf("\n");
            printf("out:"); print_msg(msg2, n); printf("\n");
            return FALSE;
        }
    }
    return TRUE;
}